

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSA.cpp
# Opt level: O1

void __thiscall Storage::Disk::MSA::MSA(MSA *this,string *file_name)

{
  FileHolder *this_00;
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  long lVar4;
  undefined4 *puVar5;
  size_t in_RCX;
  ushort uVar6;
  uint8_t value;
  uint8_t byte;
  vector<unsigned_char,_std::allocator<unsigned_char>_> track;
  uint8_t local_5b;
  char local_5a;
  uint8_t local_59;
  FILE *local_58;
  iterator iStack_50;
  uchar *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__MSA_005aa690;
  this_00 = &this->file_;
  FileHolder::FileHolder(this_00,file_name,ReadWrite);
  local_40 = &this->uncompressed_tracks_;
  (this->uncompressed_tracks_).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->uncompressed_tracks_).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uncompressed_tracks_).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = FileHolder::get16be(this_00);
  if (uVar2 == 0xe0f) {
    uVar2 = FileHolder::get16be(this_00);
    this->sectors_per_track_ = uVar2;
    uVar2 = FileHolder::get16be(this_00);
    this->sides_ = uVar2 + 1;
    uVar2 = FileHolder::get16be(this_00);
    this->starting_track_ = uVar2;
    uVar2 = FileHolder::get16be(this_00);
    this->ending_track_ = uVar2;
    do {
      uVar2 = FileHolder::get16be(this_00);
      local_5a = FileHolder::eof(this_00);
      if ((bool)local_5a) break;
      if ((uint)this->sectors_per_track_ << 9 == (uint)uVar2) {
        FileHolder::read((FileHolder *)&stack0xffffffffffffffa8,(int)this_00,(void *)(ulong)uVar2,
                         in_RCX);
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    *)local_40,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffa8
                  );
      }
      else {
        local_38 = FileHolder::tell(this_00);
        local_58 = (FILE *)0x0;
        iStack_50._M_current = (uchar *)0x0;
        local_48 = (uchar *)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffa8
                   ,(ulong)this->sectors_per_track_ << 9);
        uVar6 = 0;
        do {
          if (uVar2 <= uVar6) break;
          local_59 = FileHolder::get8(this_00);
          if (local_59 == 0xe5) {
            uVar6 = uVar6 + 4;
            bVar1 = true;
            if (uVar6 <= uVar2) {
              local_5b = FileHolder::get8(this_00);
              for (uVar3 = FileHolder::get16be(this_00); uVar3 != 0; uVar3 = uVar3 - 1) {
                if (iStack_50._M_current == local_48) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  _M_realloc_insert<unsigned_char_const&>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                             &stack0xffffffffffffffa8,iStack_50,&local_5b);
                }
                else {
                  *iStack_50._M_current = local_5b;
                  iStack_50._M_current = iStack_50._M_current + 1;
                }
              }
              goto LAB_0043ac4c;
            }
          }
          else {
            if (iStack_50._M_current == local_48) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                         &stack0xffffffffffffffa8,iStack_50,&local_59);
            }
            else {
              *iStack_50._M_current = local_59;
              iStack_50._M_current = iStack_50._M_current + 1;
            }
            uVar6 = uVar6 + 1;
LAB_0043ac4c:
            bVar1 = false;
          }
        } while (!bVar1);
        lVar4 = FileHolder::tell(this_00);
        if (lVar4 - local_38 != (ulong)uVar6) {
          __assert_fail("file_.tell() - start_of_track == pointer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/DiskImage/Formats/MSA.cpp"
                        ,0x41,"Storage::Disk::MSA::MSA(const std::string &)");
        }
        if ((uVar6 != uVar2) ||
           (in_RCX = (ulong)this->sectors_per_track_ * 0x200,
           (long)iStack_50._M_current - (long)local_58 != in_RCX)) {
          puVar5 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar5 = 0xfffffffe;
          __cxa_throw(puVar5,&Error::typeinfo,0);
        }
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    *)local_40,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffa8
                  );
      }
      if (local_58 != (FILE *)0x0) {
        operator_delete(local_58,(long)local_48 - (long)local_58);
      }
    } while (local_5a == '\0');
    if (((long)(this->uncompressed_tracks_).
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->uncompressed_tracks_).
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
        (long)(int)((uint)this->sides_ *
                   (((uint)this->ending_track_ - (uint)this->starting_track_) + 1)) == 0) {
      return;
    }
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0xfffffffe;
  __cxa_throw(puVar5,&Error::typeinfo,0);
}

Assistant:

MSA::MSA(const std::string &file_name) :
	file_(file_name) {
	const auto signature = file_.get16be();
	if(signature != 0x0e0f) throw Error::InvalidFormat;

	sectors_per_track_ = file_.get16be();
	sides_ = 1 + file_.get16be();
	starting_track_ = file_.get16be();
	ending_track_ = file_.get16be();

	// Create the uncompressed track list.
	while(true) {
		const auto data_length = file_.get16be();
		if(file_.eof()) break;

		if(data_length == sectors_per_track_ * 512) {
			// This is an uncompressed track.
			uncompressed_tracks_.push_back(file_.read(data_length));
		} else {
#ifndef NDEBUG
			const auto start_of_track = file_.tell();
#endif
			// This is an RLE-compressed track.
			std::vector<uint8_t> track;
			track.reserve(sectors_per_track_ * 512);
			uint16_t pointer = 0;
			while(pointer < data_length) {
				const auto byte = file_.get8();

				// Compression scheme: if the byte E5 is encountered, an RLE run follows.
				// An RLE run is encoded as the byte to repeat plus a 16-bit repeat count.
				if(byte != 0xe5) {
					track.push_back(byte);
					++pointer;
					continue;
				}

				pointer += 4;
				if(pointer > data_length) break;

				const auto value = file_.get8();
				auto count = file_.get16be();
				while(count--) {
					track.push_back(value);
				}
			}

#ifndef NDEBUG
			assert(file_.tell() - start_of_track == pointer);
#endif

			if(pointer != data_length || track.size() != sectors_per_track_ * 512)
				throw Error::InvalidFormat;
			uncompressed_tracks_.push_back(std::move(track));
		}
	}

	if(uncompressed_tracks_.size() != size_t((ending_track_ - starting_track_ + 1)*sides_))
		throw Error::InvalidFormat;
}